

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_erasure.cpp
# Opt level: O0

void __thiscall Drawable::Drawable<Square,void>(Drawable *this)

{
  anon_class_8_1_8991fb9c local_30;
  shared_ptr<Square> local_28;
  Drawable *local_18;
  Drawable *this_local;
  
  local_18 = this;
  std::make_shared<Square,Square&>((Square *)&local_28);
  std::shared_ptr<void>::shared_ptr<Square,void>(&this->ptr,&local_28);
  std::shared_ptr<Square>::~shared_ptr(&local_28);
  local_30.this = this;
  std::function<void(std::ostream&)>::
  function<Drawable::Drawable<Square,void>(Square)::_lambda((auto:1&)___)_1_,void>
            ((function<void(std::ostream&)> *)&this->draw,&local_30);
  return;
}

Assistant:

Drawable(T t) : ptr{std::make_shared<T>(t)}, draw{[this](auto&... args) { static_cast<T*>(ptr.get())->draw(args...); }} {}